

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

int __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::Rational>::copy
          (TypedAttribute<Imf_2_5::Rational> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Attribute *this_00;
  TypedAttribute<Imf_2_5::Rational> *pTVar1;
  
  this_00 = (Attribute *)operator_new(0x10);
  this_00->_vptr_Attribute = (_func_int **)0x0;
  this_00[1]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this_00);
  this_00->_vptr_Attribute = (_func_int **)&PTR__Attribute_0049ce10;
  this_00[1]._vptr_Attribute = (_func_int **)0x100000000;
  pTVar1 = cast(&this->super_Attribute);
  *(Rational *)(this_00 + 1) = pTVar1->_value;
  return (int)this_00;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}